

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

void luaF_closeupval(lua_State *L,StkId level)

{
  UpVal *uv_00;
  TValue *pTVar1;
  anon_union_16_2_5131162a_for_u *paVar2;
  bool bVar3;
  TValue *io2;
  TValue *io1;
  TValue *slot;
  StkId upl;
  UpVal *uv;
  StkId level_local;
  lua_State *L_local;
  
  while( true ) {
    uv_00 = L->openupval;
    bVar3 = false;
    if (uv_00 != (UpVal *)0x0) {
      bVar3 = level <= (StkId)(uv_00->v).p;
    }
    if (!bVar3) break;
    paVar2 = &uv_00->u;
    luaF_unlinkupval(uv_00);
    pTVar1 = (uv_00->v).p;
    (paVar2->open).next = (UpVal *)pTVar1->value_;
    (uv_00->u).value.tt_ = pTVar1->tt_;
    (uv_00->v).p = (TValue *)paVar2;
    if (((((uv_00->marked & 0x18) == 0) &&
         (uv_00->marked = uv_00->marked | 0x20, ((uv_00->u).value.tt_ & 0x40) != 0)) &&
        ((uv_00->marked & 0x20) != 0)) && ((((paVar2->open).next)->marked & 0x18) != 0)) {
      luaC_barrier_(L,(GCObject *)uv_00,(GCObject *)(paVar2->open).next);
    }
  }
  return;
}

Assistant:

void luaF_closeupval (lua_State *L, StkId level) {
  UpVal *uv;
  StkId upl;  /* stack index pointed by 'uv' */
  while ((uv = L->openupval) != NULL && (upl = uplevel(uv)) >= level) {
    TValue *slot = &uv->u.value;  /* new position for value */
    lua_assert(uplevel(uv) < L->top.p);
    luaF_unlinkupval(uv);  /* remove upvalue from 'openupval' list */
    setobj(L, slot, uv->v.p);  /* move value to upvalue slot */
    uv->v.p = slot;  /* now current value lives here */
    if (!iswhite(uv)) {  /* neither white nor dead? */
      nw2black(uv);  /* closed upvalues cannot be gray */
      luaC_barrier(L, uv, slot);
    }
  }
}